

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

string_t * __thiscall
pugi::xml_node::path_abi_cxx11_(string_t *__return_storage_ptr__,xml_node *this,char_t delimiter)

{
  xml_node_struct *pxVar1;
  char_t *pcVar2;
  size_t __n;
  void *__dest;
  size_t local_78;
  size_t length;
  xml_node_struct *j;
  xml_node_struct *local_30;
  xml_node_struct *i;
  size_t offset;
  char_t delimiter_local;
  xml_node *this_local;
  string_t *result;
  
  if (this->_root == (xml_node_struct *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    i = (xml_node_struct *)0x0;
    for (local_30 = this->_root; local_30 != (xml_node_struct *)0x0; local_30 = local_30->parent) {
      pxVar1 = this->_root;
      if (local_30->name == (char_t *)0x0) {
        local_78 = 0;
      }
      else {
        local_78 = impl::anon_unknown_0::strlength(local_30->name);
      }
      i = (xml_node_struct *)((long)&i->header + local_78 + (local_30 != pxVar1));
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    for (length = (size_t)this->_root; length != 0; length = *(size_t *)(length + 0x18)) {
      if ((xml_node_struct *)length != this->_root) {
        i = (xml_node_struct *)((long)&i[-1].first_attribute + 7);
        pcVar2 = (char_t *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        *pcVar2 = delimiter;
      }
      if (*(long *)(length + 8) != 0) {
        __n = impl::anon_unknown_0::strlength(*(char_t **)(length + 8));
        i = (xml_node_struct *)((long)i - __n);
        __dest = (void *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        memcpy(__dest,*(void **)(length + 8),__n);
      }
    }
    if (i != (xml_node_struct *)0x0) {
      __assert_fail("offset == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                    ,0x185c,"string_t pugi::xml_node::path(char_t) const");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN string_t xml_node::path(char_t delimiter) const
	{
		if (!_root) return string_t();

		size_t offset = 0;

		for (xml_node_struct* i = _root; i; i = i->parent)
		{
			offset += (i != _root);
			offset += i->name ? impl::strlength(i->name) : 0;
		}

		string_t result;
		result.resize(offset);

		for (xml_node_struct* j = _root; j; j = j->parent)
		{
			if (j != _root)
				result[--offset] = delimiter;

			if (j->name)
			{
				size_t length = impl::strlength(j->name);

				offset -= length;
				memcpy(&result[offset], j->name, length * sizeof(char_t));
			}
		}

		assert(offset == 0);

		return result;
	}